

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperatorOverflowCheck,bool,true,false>
               (int *ldata,int *rdata,int *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  idx_t iVar5;
  int lentry;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar3 = *ldata;
      iVar5 = 0;
      do {
        iVar2 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar3,rdata[iVar5]);
        result_data[iVar5] = iVar2;
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    uVar8 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar1[uVar4];
      }
      uVar7 = uVar8 + 0x40;
      if (count <= uVar8 + 0x40) {
        uVar7 = count;
      }
      uVar9 = uVar7;
      if (uVar6 != 0) {
        uVar9 = uVar8;
        if (uVar6 == 0xffffffffffffffff) {
          if (uVar8 < uVar7) {
            iVar3 = *ldata;
            do {
              iVar2 = SubtractOperatorOverflowCheck::Operation<int,int,int>(iVar3,rdata[uVar8]);
              result_data[uVar8] = iVar2;
              uVar8 = uVar8 + 1;
              uVar9 = uVar8;
            } while (uVar7 != uVar8);
          }
        }
        else if (uVar8 < uVar7) {
          uVar9 = 0;
          do {
            if ((uVar6 >> (uVar9 & 0x3f) & 1) != 0) {
              iVar3 = SubtractOperatorOverflowCheck::Operation<int,int,int>
                                (*ldata,rdata[uVar8 + uVar9]);
              result_data[uVar8 + uVar9] = iVar3;
            }
            uVar9 = uVar9 + 1;
          } while ((uVar8 - uVar7) + uVar9 != 0);
          uVar9 = uVar8 + uVar9;
        }
      }
      uVar4 = uVar4 + 1;
      uVar8 = uVar9;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}